

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printArray(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  Value *local_40;
  Ref node_local;
  Ref args;
  
  local_40 = node.inst;
  emit(this,'[');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_40);
  node_local.inst = (Value *)*puVar1;
  uVar3 = 0;
  while( true ) {
    sVar2 = Value::size(node_local.inst);
    if (sVar2 <= uVar3) break;
    if (uVar3 != 0) {
      if (this->pretty == true) {
        emit(this,", ");
      }
      else {
        emit(this,',');
      }
    }
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&node_local);
    print(this,(Value *)*puVar1);
    uVar3 = uVar3 + 1;
  }
  emit(this,']');
  return;
}

Assistant:

void printArray(Ref node) {
    emit('[');
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      print(args[i]);
    }
    emit(']');
  }